

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filon.cpp
# Opt level: O0

double filon_fun_cos(int n,_func_double_ptr_int_double_ptr *f,double a,double b,double t)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  __type _Var9;
  __type _Var10;
  __type _Var11;
  __type _Var12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *x;
  double value;
  double theta;
  double sint;
  int i;
  double h;
  double gamma;
  double *ftab;
  double cost;
  double c2nm1;
  double c2n;
  double beta;
  double alpha;
  double t_local;
  double b_local;
  double a_local;
  _func_double_ptr_int_double_ptr *f_local;
  double dStack_10;
  int n_local;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    if (n < 2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  N < 2\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"  N = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      std::operator<<(poVar2,"\n");
      exit(1);
    }
    if (n % 2 != 1) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  N must be odd.\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"  N = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      std::operator<<(poVar2,"\n");
      exit(1);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)n;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    for (sint._4_4_ = 0; sint._4_4_ < n; sint._4_4_ = sint._4_4_ + 1) {
      pdVar4[sint._4_4_] =
           ((double)((n - sint._4_4_) + -1) * a + (double)sint._4_4_ * b) / (double)(n + -1);
    }
    dStack_10 = (b - a) / (double)(n + -1);
    dVar6 = t * dStack_10;
    dVar7 = sin(dVar6);
    dVar8 = cos(dVar6);
    if (1.0 < ABS(dVar6) * 6.0) {
      _Var9 = std::pow<double,int>(dVar6,2);
      _Var10 = std::pow<double,int>(dVar6,3);
      beta = (-(dVar7 * 2.0) * dVar7 + dVar6 * dVar7 * dVar8 + _Var9) / _Var10;
      _Var9 = std::pow<double,int>(dVar6,3);
      c2n = (-(dVar7 * 4.0) * dVar8 + dVar6 + dVar6 + dVar6 * 2.0 * dVar8 * dVar8) / _Var9;
      _Var9 = std::pow<double,int>(dVar6,3);
      h = ((-dVar6 * dVar8 + dVar7) * 4.0) / _Var9;
    }
    else {
      _Var9 = std::pow<double,int>(dVar6,3);
      _Var10 = std::pow<double,int>(dVar6,5);
      _Var11 = std::pow<double,int>(dVar6,7);
      beta = ((_Var9 * 2.0) / 45.0 - (_Var10 * 2.0) / 315.0) + (_Var11 * 2.0) / 4725.0;
      _Var9 = std::pow<double,int>(dVar6,2);
      _Var10 = std::pow<double,int>(dVar6,4);
      _Var11 = std::pow<double,int>(dVar6,6);
      _Var12 = std::pow<double,int>(dVar6,8);
      c2n = ((((_Var9 * 2.0) / 15.0 + 0.6666666666666666) - (_Var10 * 4.0) / 105.0) +
            (_Var11 * 2.0) / 567.0) - (_Var12 * 4.0) / 22275.0;
      _Var9 = std::pow<double,int>(dVar6,2);
      _Var10 = std::pow<double,int>(dVar6,4);
      _Var11 = std::pow<double,int>(dVar6,6);
      h = ((1.3333333333333333 - (_Var9 * 2.0) / 15.0) + _Var10 / 210.0) - _Var11 / 11340.0;
    }
    pdVar5 = (*f)(n,pdVar4);
    dVar6 = *pdVar5;
    dVar7 = cos(t * *pdVar4);
    c2nm1 = dVar6 * 0.5 * dVar7;
    for (sint._4_4_ = 2; sint._4_4_ < n + -1; sint._4_4_ = sint._4_4_ + 2) {
      dVar6 = pdVar5[sint._4_4_];
      dVar7 = cos(t * pdVar4[sint._4_4_]);
      c2nm1 = dVar6 * dVar7 + c2nm1;
    }
    dVar6 = pdVar5[n + -1];
    dVar7 = cos(t * pdVar4[n + -1]);
    cost = 0.0;
    for (sint._4_4_ = 1; sint._4_4_ <= n + -2; sint._4_4_ = sint._4_4_ + 2) {
      dVar8 = pdVar5[sint._4_4_];
      dVar13 = cos(t * pdVar4[sint._4_4_]);
      cost = dVar8 * dVar13 + cost;
    }
    dVar8 = pdVar5[n + -1];
    dVar14 = sin(t * pdVar4[n + -1]);
    dVar13 = *pdVar5;
    dVar15 = sin(t * *pdVar4);
    dStack_10 = dStack_10 *
                (h * cost +
                beta * (dVar8 * dVar14 + -(dVar13 * dVar15)) + c2n * (dVar6 * 0.5 * dVar7 + c2nm1));
    if (pdVar5 != (double *)0x0) {
      operator_delete__(pdVar5);
    }
    if (pdVar4 != (double *)0x0) {
      operator_delete__(pdVar4);
    }
  }
  else {
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

double filon_fun_cos ( int n, double *f ( int n, double x[] ), double a, 
  double b, double t )

//****************************************************************************80
//
//  Purpose:
//
//    FILON_FUN_COS uses Filon's method on integrals with a cosine factor.
//
//  Discussion:
//
//    The integral to be approximated has the form:
//
//      Integral ( A <= X <= B ) F(X) * COS(T*X) dX
//
//    where T is user specified.
//
//    The function is interpolated over each subinterval by
//    a parabolic arc.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Chase, Lloyd Fosdick,
//    An Algorithm for Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 453-457.
//
//    Stephen Chase, Lloyd Fosdick,
//    Algorithm 353:
//    Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 457-458.
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int N, the number of data points.
//    N must be odd, and greater than 1.
//
//    Input, double *F ( int n, double x[] ), the function which evaluates the 
//    integrand.
//
//    Input, double A, B, the limits of integration.
//
//    Input, double T, the multiplier of the X argument of the cosine.
//
//    Output, double FILON_FUN_COS, the approximate value of the integral.
//
{
  double alpha;
  double beta;
  double c2n;
  double c2nm1;
  double cost;
  double *ftab;
  double gamma;
  double h;
  int i;
  double sint;
  double theta;
  double value;
  double *x;

  if ( a == b )
  {
    value = 0.0;
    return value;
  }
 
  if ( n <= 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N < 2\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
 
  if ( ( n % 2 ) != 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N must be odd.\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
//
//  Set the X values.
//
  x = new double[n];
  for ( i = 0; i < n; i++ )
  {
    x[i] = ( static_cast<double> ( n - i - 1 ) * a   
           + static_cast<double> (     i     ) * b ) 
           / static_cast<double> ( n     - 1 );
  }

  h = ( b - a ) / static_cast<double> ( n - 1 );
  theta = t * h;
  sint = sin ( theta );
  cost = cos ( theta );

  if ( 6.0 * fabs ( theta ) <= 1.0 )
  {
    alpha = 2.0 * pow ( theta, 3 ) /   45.0 
          - 2.0 * pow ( theta, 5 ) /  315.0 
          + 2.0 * pow ( theta, 7 ) / 4725.0;
  
    beta =  2.0                    /     3.0 
          + 2.0 * pow ( theta, 2 ) /    15.0 
          - 4.0 * pow ( theta, 4 ) /   105.0 
          + 2.0 * pow ( theta, 6 ) /   567.0 
          - 4.0 * pow ( theta, 8 ) / 22275.0;

    gamma = 4.0                    /      3.0 
          - 2.0 * pow ( theta, 2 ) /     15.0 
          +       pow ( theta, 4 ) /    210.0 
          -       pow ( theta, 6 ) /  11340.0;
  }
  else
  {
    alpha = ( pow ( theta, 2 ) + theta * sint * cost - 2.0 * sint * sint ) 
      / pow ( theta, 3 );

    beta = ( 2.0 * theta + 2.0 * theta * cost * cost
      - 4.0 * sint * cost ) / pow ( theta, 3 );

    gamma = 4.0 * ( sint - theta * cost ) / pow ( theta, 3 );
  }
//
//  Tabulate the function.
//
  ftab = f ( n, x );

  c2n = 0.5 * ftab[0] * cos ( t * x[0] );
  for ( i = 2; i < n - 1; i = i + 2 )
  {
    c2n = c2n + ftab[i] * cos ( t * x[i] );
  }
  c2n = c2n + 0.5 * ftab[n-1] * cos ( t * x[n-1] );

  c2nm1 = 0.0;
  for ( i = 1; i <= n - 2; i = i + 2 )
  {
    c2nm1 = c2nm1 + ftab[i] * cos ( t * x[i] );
  }

  value = h * ( 
      alpha * ( ftab[n-1] * sin ( t * x[n-1] )  
              - ftab[0]   * sin ( t * x[0] ) ) 
    + beta * c2n 
    + gamma * c2nm1 );

  delete [] ftab;
  delete [] x;

  return value;
}